

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_test.cpp
# Opt level: O3

int main(void)

{
  iterator it_00;
  cake_iterator<false> first;
  cake_iterator<true> first_00;
  cake_iterator<false> first_01;
  cake_iterator<true> first_02;
  cake_iterator<true> first_03;
  cake_iterator<false> first_04;
  cake_iterator<false> first_05;
  cake_iterator<false> last;
  cake_iterator<true> last_00;
  cake_iterator<false> last_01;
  cake_iterator<true> last_02;
  cake_iterator<true> last_03;
  cake_iterator<false> last_04;
  cake_iterator<false> last_05;
  int iVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  byte bVar5;
  int i;
  uint value;
  char *pcVar6;
  uint uVar7;
  iterator it;
  skiplist<int,_std::less<int>_> iskip;
  skiplist<int,_std::less<int>_> uskip;
  skiplist<int,_std::less<int>_> yskip;
  undefined4 in_stack_ffffffffffffe080;
  undefined4 in_stack_ffffffffffffe084;
  int iVar8;
  undefined1 in_stack_ffffffffffffe088;
  undefined1 uVar9;
  undefined7 in_stack_ffffffffffffe089;
  SLNode<int> *in_stack_ffffffffffffe090;
  SLNode<int> *pSVar10;
  undefined4 in_stack_ffffffffffffe098;
  undefined4 in_stack_ffffffffffffe09c;
  int iVar11;
  undefined1 in_stack_ffffffffffffe0a0;
  undefined1 uVar12;
  undefined7 in_stack_ffffffffffffe0a1;
  SLNode<int> *in_stack_ffffffffffffe0a8;
  SLNode<int> *pSVar13;
  iterator local_1e60;
  undefined8 local_1e48;
  undefined1 uStack_1e40;
  undefined8 local_1e38;
  skiplist<int,_std::less<int>_> local_1e30;
  skiplist<int,_std::less<int>_> local_1428;
  skiplist<int,_std::less<int>_> local_a20;
  
  skiplist<int,_std::less<int>_>::skiplist(&local_1e30);
  bVar5 = 0;
  uVar7 = 2;
  do {
    value = uVar7;
    if ((uVar7 - 2 & 1) != 0) {
      cVar3 = (char)((uint)bVar5 * 0x25 >> 8);
      value = (uint)(byte)(bVar5 + ((byte)(((byte)(bVar5 - cVar3) >> 1) + cVar3) >> 2) * -7);
    }
    skiplist<int,_std::less<int>_>::insert(&local_1e30,value);
    bVar5 = bVar5 + 1;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x17);
  operator<<((ostream *)&std::cout,&local_1e30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward iterator :\n",0x13);
  local_1e38 = 0;
  local_1e48 = 0;
  uStack_1e40 = 0;
  first.node_count_ref_ = in_stack_ffffffffffffe084;
  first.node_count_ = in_stack_ffffffffffffe080;
  first.reverse_ = (bool)in_stack_ffffffffffffe088;
  first._9_7_ = in_stack_ffffffffffffe089;
  first.node = in_stack_ffffffffffffe090;
  last.node_count_ref_ = in_stack_ffffffffffffe09c;
  last.node_count_ = in_stack_ffffffffffffe098;
  last.reverse_ = (bool)in_stack_ffffffffffffe0a0;
  last._9_7_ = in_stack_ffffffffffffe0a1;
  last.node = in_stack_ffffffffffffe0a8;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first,last);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reverse iterator:\n",0x12);
  first_00.node_count_ref_ = in_stack_ffffffffffffe084;
  first_00.node_count_ = in_stack_ffffffffffffe080;
  first_00.reverse_ = (bool)in_stack_ffffffffffffe088;
  first_00._9_7_ = in_stack_ffffffffffffe089;
  first_00.node = in_stack_ffffffffffffe090;
  last_00.node_count_ref_ = in_stack_ffffffffffffe09c;
  last_00.node_count_ = in_stack_ffffffffffffe098;
  last_00.reverse_ = (bool)in_stack_ffffffffffffe0a0;
  last_00._9_7_ = in_stack_ffffffffffffe0a1;
  last_00.node = in_stack_ffffffffffffe0a8;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_00,last_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Erasing with iterators:\n",0x18);
  skiplist<int,_std::less<int>_>::find(&local_1e60,&local_1e30,3);
  if ((local_1e60.node == (SLNode<int> *)0x0) && (local_1e60.node_count_ == 0)) {
    lVar4 = 0x15;
    pcVar6 = "Something very wrong\n";
  }
  else {
    it_00.node_count_ref_ = local_1e60.node_count_ref_;
    it_00.node_count_ = local_1e60.node_count_;
    it_00.reverse_ = local_1e60.reverse_;
    it_00._9_7_ = local_1e60._9_7_;
    it_00.node = local_1e60.node;
    skiplist<int,_std::less<int>_>::erase((iterator *)&local_1428,&local_1e30,it_00);
    lVar4 = 0x13;
    pcVar6 = "Erased (I think?) \n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward constant iterator :\n",0x1c);
  if (local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar13 = (SLNode<int> *)0x0;
    iVar1 = 0;
  }
  else {
    pSVar13 = (*local_1e30.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->next;
    iVar1 = 0;
    if (pSVar13 != (SLNode<int> *)0x0) {
      iVar1 = pSVar13->count + -1;
    }
  }
  uVar12 = 0;
  first_01.node_count_ref_ = in_stack_ffffffffffffe084;
  first_01.node_count_ = in_stack_ffffffffffffe080;
  first_01.reverse_ = (bool)in_stack_ffffffffffffe088;
  first_01._9_7_ = in_stack_ffffffffffffe089;
  first_01.node = in_stack_ffffffffffffe090;
  last_01.node_count_ref_ = iVar1;
  last_01.node_count_ = iVar1;
  last_01.reverse_ = false;
  last_01._9_7_ = in_stack_ffffffffffffe0a1;
  last_01.node = pSVar13;
  iVar11 = iVar1;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_01,last_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reverse constant iterator:\n",0x1b);
  first_02.node_count_ref_ = in_stack_ffffffffffffe084;
  first_02.node_count_ = in_stack_ffffffffffffe080;
  first_02.reverse_ = (bool)in_stack_ffffffffffffe088;
  first_02._9_7_ = in_stack_ffffffffffffe089;
  first_02.node = in_stack_ffffffffffffe090;
  last_02.node_count_ref_ = iVar11;
  last_02.node_count_ = iVar1;
  last_02.reverse_ = (bool)uVar12;
  last_02._9_7_ = in_stack_ffffffffffffe0a1;
  last_02.node = pSVar13;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_02,last_02);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nENDL\n\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating a new skiplist with the copy constructor:\n",0x33);
  skiplist<int,_std::less<int>_>::skiplist(&local_1428,&local_1e30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reverse constant iterator\n",0x1a);
  first_03.node_count_ref_ = in_stack_ffffffffffffe084;
  first_03.node_count_ = in_stack_ffffffffffffe080;
  first_03.reverse_ = (bool)in_stack_ffffffffffffe088;
  first_03._9_7_ = in_stack_ffffffffffffe089;
  first_03.node = in_stack_ffffffffffffe090;
  last_03.node_count_ref_ = iVar11;
  last_03.node_count_ = iVar1;
  last_03.reverse_ = (bool)uVar12;
  last_03._9_7_ = in_stack_ffffffffffffe0a1;
  last_03.node = pSVar13;
  display<skiplist<int,std::less<int>>::cake_iterator<true>>(first_03,last_03);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deleting elements - 0 20 22\n",0x1c);
  skiplist<int,_std::less<int>_>::erase(&local_1428,0x14);
  skiplist<int,_std::less<int>_>::erase(&local_1428,0);
  skiplist<int,_std::less<int>_>::erase(&local_1428,0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward iterator :\n",0x13);
  if (local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar10 = (SLNode<int> *)0x0;
    iVar2 = 0;
  }
  else {
    pSVar10 = (*local_1428.key.super__Vector_base<SLNode<int>_*,_std::allocator<SLNode<int>_*>_>.
                _M_impl.super__Vector_impl_data._M_start)->next;
    iVar2 = 0;
    if (pSVar10 != (SLNode<int> *)0x0) {
      iVar2 = pSVar10->count + -1;
    }
  }
  uVar9 = 0;
  first_04.node_count_ref_ = iVar2;
  first_04.node_count_ = iVar2;
  first_04.reverse_ = false;
  first_04._9_7_ = in_stack_ffffffffffffe089;
  first_04.node = pSVar10;
  last_04.node_count_ref_ = iVar11;
  last_04.node_count_ = iVar1;
  last_04.reverse_ = (bool)uVar12;
  last_04._9_7_ = in_stack_ffffffffffffe0a1;
  last_04.node = pSVar13;
  iVar8 = iVar2;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_04,last_04);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nENDL\n\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating a new skiplist with the copy assignment operator:\n",
             0x3b);
  skiplist<int,_std::less<int>_>::skiplist(&local_a20,&local_1428);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Forward iterator :\n",0x13);
  first_05.node_count_ref_ = iVar8;
  first_05.node_count_ = iVar2;
  first_05.reverse_ = (bool)uVar9;
  first_05._9_7_ = in_stack_ffffffffffffe089;
  first_05.node = pSVar10;
  last_05.node_count_ref_ = iVar11;
  last_05.node_count_ = iVar1;
  last_05.reverse_ = (bool)uVar12;
  last_05._9_7_ = in_stack_ffffffffffffe0a1;
  last_05.node = pSVar13;
  display<skiplist<int,std::less<int>>::cake_iterator<false>>(first_05,last_05);
  skiplist<int,_std::less<int>_>::~skiplist(&local_a20);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1428);
  skiplist<int,_std::less<int>_>::~skiplist(&local_1e30);
  return 0;
}

Assistant:

int main() {
    skiplist<int> iskip;
    for(int i=0; i<21; i++)
    {
        if(i%2)
            iskip.insert(i%7);
        else
            iskip.insert(i+2);
    }
    std::cout << iskip;

    std::cout << "Forward iterator :\n";
    display(iskip.begin(), iskip.end());

    std::cout << "Reverse iterator:\n";
    display(iskip.rbegin(), iskip.rend());

    std::cout << "Erasing with iterators:\n";
    auto it = iskip.find(3);
    if(it != std::end(iskip)) {
        iskip.erase(it);
        std::cout << "Erased (I think?) \n";
    }
    else
        std::cout << "Something very wrong\n";

    std::cout << "Forward constant iterator :\n";
    display(iskip.cbegin(), iskip.cend());

    std::cout << "Reverse constant iterator:\n";
    display(iskip.crbegin(), iskip.crend());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy constructor:\n";

    skiplist<int> uskip(iskip);
    std::cout << "Reverse constant iterator\n";
    display(uskip.crbegin(), uskip.crend());
    std::cout << "Deleting elements - 0 20 22\n";
    uskip.erase(20);
    uskip.erase(0);
    uskip.erase(22);
    std::cout << "Forward iterator :\n";
    display(uskip.begin(), uskip.end());

    std::cout << "\nENDL\n\n";
    std::cout << "Creating a new skiplist with the copy assignment operator:\n";

    skiplist<int> yskip = uskip;
    std::cout << "Forward iterator :\n";
    display(yskip.begin(), yskip.end());
}